

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int pixel_filter_helper(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  int extraout_EAX;
  int iVar4;
  fitsfile *outfptr;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  int hdunum;
  char *DEFAULT_TAG;
  int local_11c;
  char *local_118;
  char *local_110;
  PixelFilter local_108;
  
  memset(&local_108,0,0xd8);
  local_108.tag = &local_110;
  local_110 = "X";
  local_108.count = 1;
  local_108.ifptr = fptr;
  iVar3 = ffinit(&local_108.ofptr,outfile,status);
  if (0 < iVar3) {
    ffpmsg("failed to create output file for pixel filter:");
    ffpmsg(outfile);
    return extraout_EAX;
  }
  ffghdn(*fptr,&local_11c);
  bVar2 = expr[3];
  iVar3 = 8;
  if (bVar2 < 0x62) {
    switch(bVar2) {
    case 0x42:
      break;
    case 0x43:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
      goto switchD_0010cba3_caseD_43;
    case 0x44:
switchD_0010cba3_caseD_44:
      iVar3 = -0x40;
      break;
    case 0x49:
switchD_0010cba3_caseD_49:
      iVar3 = 0x10;
      break;
    case 0x4a:
switchD_0010cba3_caseD_4a:
      iVar3 = 0x20;
      break;
    default:
      if (bVar2 != 0x52) goto switchD_0010cba3_caseD_43;
LAB_0010cbef:
      iVar3 = -0x20;
    }
switchD_0010cba3_caseD_42:
    pcVar5 = expr + 4;
    local_108.bitpix = iVar3;
  }
  else {
    switch(bVar2) {
    case 0x62:
      goto switchD_0010cba3_caseD_42;
    case 99:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
      break;
    case 100:
      goto switchD_0010cba3_caseD_44;
    case 0x69:
      goto switchD_0010cba3_caseD_49;
    case 0x6a:
      goto switchD_0010cba3_caseD_4a;
    default:
      if (bVar2 == 0x72) goto LAB_0010cbef;
    }
switchD_0010cba3_caseD_43:
    pcVar5 = expr + 4;
    if (local_108.bitpix == 0) {
      pcVar5 = expr + 3;
    }
  }
  bVar6 = *pcVar5 == '1';
  bVar7 = (*fptr)->Fptr->only_one == 0;
  if (pcVar5[bVar6] != ' ') {
    local_118 = pcVar5 + bVar6;
    ffpmsg("pixel filtering expression not space separated:");
    ffpmsg(local_118);
  }
  outfptr = local_108.ofptr;
  pcVar5 = pcVar5 + ((ulong)bVar6 - 1);
  do {
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while (*pcVar1 == ' ');
  if (1 < local_11c && (!bVar6 && bVar7)) {
    iVar3 = 1;
    do {
      ffmahd(*fptr,iVar3,(int *)0x0,status);
      iVar4 = ffcopy(*fptr,outfptr,0,status);
      if (0 < iVar4) goto LAB_0010ccf1;
      iVar3 = iVar3 + 1;
    } while (iVar3 < local_11c);
  }
  ffmahd(*fptr,local_11c,(int *)0x0,status);
  local_108.expression = pcVar5;
  iVar4 = fits_pixel_filter(&local_108,status);
  iVar3 = local_11c;
  if (iVar4 == 0) {
    if (!bVar6 && bVar7) {
      iVar4 = ffmahd(*fptr,local_11c + 1,(int *)0x0,status);
      while (iVar4 < 1) {
        ffcopy(*fptr,local_108.ofptr,0,status);
        iVar4 = ffmahd(*fptr,iVar3 + 2,(int *)0x0,status);
        iVar3 = iVar3 + 1;
      }
    }
    if (*status == 0x6b) {
      *status = 0;
    }
    else {
      outfptr = local_108.ofptr;
      if (0 < *status) goto LAB_0010ccf1;
    }
    iVar4 = ffclos(*fptr,status);
    *fptr = local_108.ofptr;
    if (iVar3 != local_11c) {
      iVar4 = ffmahd(local_108.ofptr,local_11c,(int *)0x0,status);
    }
  }
  else {
    ffpmsg("failed to execute image filter:");
    ffpmsg(pcVar5);
    outfptr = local_108.ofptr;
LAB_0010ccf1:
    iVar4 = ffclos(outfptr,status);
  }
  return iVar4;
}

Assistant:

int pixel_filter_helper(
           fitsfile **fptr,  /* IO - pointer to input image; on output it  */
                             /*      points to the new image */
           char *outfile,    /* I - name for output file        */
           char *expr,       /* I - Image filter expression    */
           int *status)
{
	PixelFilter filter = { 0 };
	char * DEFAULT_TAG = "X";
	int ii, hdunum;
        int singleHDU = 0;

	filter.count = 1;
	filter.ifptr = fptr;
	filter.tag = &DEFAULT_TAG;

    /* create new empty file for result */
    if (ffinit(&filter.ofptr, outfile, status) > 0)
    {
        ffpmsg("failed to create output file for pixel filter:");
        ffpmsg(outfile);
        return(*status);
    }

    fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

    expr += 3; /* skip 'pix' */
    switch (expr[0]) {
       case 'b': 
       case 'B': filter.bitpix = BYTE_IMG; break;
       case 'i':
       case 'I': filter.bitpix = SHORT_IMG; break;
       case 'j':
       case 'J': filter.bitpix = LONG_IMG; break;
       case 'r':
       case 'R': filter.bitpix = FLOAT_IMG; break;
       case 'd':
       case 'D': filter.bitpix = DOUBLE_IMG; break;
    }
    if (filter.bitpix) /* skip bitpix indicator */
       ++expr;

    if (*expr == '1') {
       ++expr;
       singleHDU = 1;
    }

    if (((*fptr)->Fptr)->only_one)
       singleHDU = 1;

    if (*expr != ' ') {
       ffpmsg("pixel filtering expression not space separated:");
       ffpmsg(expr);
    }
    while (*expr == ' ')
       ++expr;

    /* copy all preceding extensions to the output file */
    for (ii = 1; !singleHDU && ii < hdunum; ii++)
    {
        fits_movabs_hdu(*fptr, ii, NULL, status);
        if (fits_copy_hdu(*fptr, filter.ofptr, 0, status) > 0)
        {
            ffclos(filter.ofptr, status);
            return(*status);
        }
    }

    /* move back to the original HDU position */
    fits_movabs_hdu(*fptr, hdunum, NULL, status);

	filter.expression = expr;
    if (fits_pixel_filter(&filter, status)) {
        ffpmsg("failed to execute image filter:");
        ffpmsg(expr);
        ffclos(filter.ofptr, status);
        return(*status);
    }


    /* copy any remaining HDUs to the output file */

    for (ii = hdunum + 1; !singleHDU; ii++)
    {
        if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

        fits_copy_hdu(*fptr, filter.ofptr, 0, status);
    }

    if (*status == END_OF_FILE)   
        *status = 0;              /* got the expected EOF error; reset = 0  */
    else if (*status > 0)
    {
        ffclos(filter.ofptr, status);
        return(*status);
    }

    /* close the original file and return ptr to the new image */
    ffclos(*fptr, status);

    *fptr = filter.ofptr; /* reset the pointer to the new table */

    /* move back to the image subsection */
    if (ii - 1 != hdunum)
        fits_movabs_hdu(*fptr, hdunum, NULL, status);

    return(*status);
}